

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiWindow *window;
  
  pIVar3 = GImGui;
  if ((flags & 4U) != 0) {
    window = GImGui->HoveredWindow;
    if (window == (ImGuiWindow *)0x0) {
      return false;
    }
    goto LAB_001517a9;
  }
  window = GImGui->HoveredWindow;
  switch(flags & 3) {
  case 0:
    pIVar2 = GImGui->CurrentWindow;
    break;
  case 1:
    if (window == (ImGuiWindow *)0x0) {
      return false;
    }
    bVar4 = IsWindowChildOf(window,GImGui->CurrentWindow);
    if (!bVar4) {
      return false;
    }
    goto LAB_001517a9;
  case 2:
    pIVar2 = GImGui->CurrentWindow->RootWindowDockStop;
    break;
  case 3:
    if (window == (ImGuiWindow *)0x0) {
      return false;
    }
    if (window->RootWindowDockStop != GImGui->CurrentWindow->RootWindowDockStop) {
      return false;
    }
    goto LAB_001517a9;
  }
  if (window != pIVar2) {
    return false;
  }
LAB_001517a9:
  bVar4 = IsWindowContentHoverable(window,flags);
  if ((bVar4) &&
     (((((flags & 0x20U) != 0 || (IVar1 = pIVar3->ActiveId, IVar1 == 0)) ||
       (pIVar3->ActiveIdAllowOverlap != false)) || (IVar1 == window->MoveId)))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiHoveredFlags_AnyWindow)
    {
        if (g.HoveredWindow == NULL)
            return false;
    }
    else
    {
        switch (flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows))
        {
        case ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || g.HoveredWindow->RootWindowDockStop != g.CurrentWindow->RootWindowDockStop)
                return false;
            break;
        case ImGuiHoveredFlags_RootWindow:
            if (g.HoveredWindow != g.CurrentWindow->RootWindowDockStop)
                return false;
            break;
        case ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || !IsWindowChildOf(g.HoveredWindow, g.CurrentWindow))
                return false;
            break;
        default:
            if (g.HoveredWindow != g.CurrentWindow)
                return false;
            break;
        }
    }

    if (!IsWindowContentHoverable(g.HoveredWindow, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != g.HoveredWindow->MoveId)
            return false;
    return true;
}